

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_indentation(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  csubstr s_00;
  ro_substr chars;
  bool bVar7;
  error_flags eVar8;
  size_t sVar9;
  iterator pSVar10;
  iterator pSVar11;
  Parser *in_RDI;
  Parser *in_stack_00000070;
  csubstr in_stack_00000078;
  char msg_5 [38];
  char msg_4 [39];
  State *parent;
  State *s;
  char msg_3 [40];
  State *popto;
  char msg_2 [31];
  char msg_1 [30];
  csubstr remt;
  csubstr rem;
  size_t ind;
  char msg [31];
  flag_t in_stack_fffffffffffffba8;
  flag_t in_stack_fffffffffffffbac;
  Parser *in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  size_t in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  Location *in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbf0;
  pfn_error p_Var12;
  basic_substring<const_char> *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined7 uVar13;
  char in_stack_fffffffffffffc07;
  basic_substring<const_char> *in_stack_fffffffffffffc08;
  char *pcVar14;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  basic_substring<const_char> *str;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 uVar15;
  Parser *in_stack_fffffffffffffc90;
  basic_substring<char_const> local_360 [16];
  char *local_350;
  size_t local_348;
  undefined8 local_340;
  Parser *pPStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  char *local_320;
  size_t in_stack_fffffffffffffce8;
  Parser *in_stack_fffffffffffffcf0;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  size_t local_2d0;
  char local_2c8 [40];
  basic_substring<char_const> local_2a0 [16];
  iterator local_290;
  iterator local_288;
  undefined8 local_280;
  Parser *pPStack_278;
  size_t local_270;
  size_t sStack_268;
  char *local_260;
  char local_258 [48];
  iterator local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  Parser *pPStack_208;
  size_t local_200;
  size_t sStack_1f8;
  char *local_1f0;
  char local_1e8 [40];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  Parser *pPStack_1a8;
  size_t local_1a0;
  size_t sStack_198;
  char *local_190;
  char local_188 [32];
  basic_substring<const_char> local_168;
  basic_substring<const_char> local_158;
  char *local_148;
  size_t local_140;
  size_t local_138;
  undefined8 local_130;
  Parser *pPStack_128;
  size_t local_120;
  size_t sStack_118;
  char *local_110;
  char local_108 [55];
  bool local_d1;
  basic_substring<const_char> *local_d0;
  char *local_c8;
  undefined4 local_c0;
  ulong local_b8;
  char **local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined4 local_90;
  ulong local_88;
  char **local_80;
  undefined8 local_78;
  undefined8 local_70;
  char *local_68;
  undefined4 local_60;
  ulong local_58;
  char **local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  Tree *local_30;
  NodeData *local_28;
  size_t local_20;
  Tree *local_18;
  NodeData *local_10;
  char **local_8;
  
  bVar7 = has_none(in_RDI,0x10);
  if (!bVar7) {
    builtin_strncpy(local_108,"check failed: (has_none(FLOW))",0x1f);
    eVar8 = get_error_flags();
    if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0
                       ,in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
    in_stack_fffffffffffffba8 = (flag_t)local_130;
    in_stack_fffffffffffffbac = (flag_t)((ulong)local_130 >> 0x20);
    LVar1.super_LineCol.line = (size_t)pPStack_128;
    LVar1.super_LineCol.offset = local_130;
    LVar1.super_LineCol.col = local_120;
    LVar1.name.str = (char *)sStack_118;
    LVar1.name.len = (size_t)local_110;
    (*p_Var12)(local_108,0x1f,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffbb0 = pPStack_128;
    in_stack_fffffffffffffbb8 = local_120;
    in_stack_fffffffffffffbc0 = sStack_118;
    in_stack_fffffffffffffbc8 = local_110;
  }
  bVar7 = _at_line_begin(in_RDI);
  if (!bVar7) {
    return false;
  }
  local_138 = (in_RDI->m_state->line_contents).indentation;
  local_148 = (in_RDI->m_state->line_contents).rem.str;
  local_140 = (in_RDI->m_state->line_contents).rem.len;
  local_158 = basic_substring<const_char>::triml
                        (in_stack_fffffffffffffc08,in_stack_fffffffffffffc07);
  str = &local_158;
  uVar15 = true;
  if (local_158.len != 0) {
    uVar15 = local_158.str == (char *)0x0;
  }
  local_d0 = str;
  if (((bool)uVar15 != false) ||
     (bVar7 = basic_substring<const_char>::begins_with(&local_158,'#'), bVar7)) {
    local_8 = &local_148;
    _line_progressed(in_stack_fffffffffffffc90,(size_t)in_RDI);
    return true;
  }
  if (local_138 == in_RDI->m_state->indref) {
    local_50 = &local_148;
    local_58 = local_138;
    if (local_140 < local_138) {
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      local_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x1533;
      handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               in_stack_fffffffffffffbc0);
    local_168.str = local_48;
    local_168.len = local_40;
    bVar7 = basic_substring<const_char>::begins_with(&local_168,'-');
    if (((bVar7 ^ 0xffU) & 1) != 0) {
      bVar7 = has_any(in_RDI,4);
      if (bVar7) {
        bVar7 = has_all(in_RDI,0x280);
        if (bVar7) {
          _append_key_val_null((Parser *)CONCAT17(uVar15,in_stack_fffffffffffffc70),(char *)str);
          addrem_flags(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                      );
        }
      }
      else {
        bVar7 = has_any(in_RDI,8);
        if ((bVar7) &&
           (sVar9 = detail::stack<c4::yml::Parser::State,_16UL>::size(&in_RDI->m_stack), 2 < sVar9))
        {
          bVar7 = has_any(in_RDI,0x100);
          if (bVar7) {
            _pop_level((Parser *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
            return true;
          }
          bVar7 = has_any(in_RDI,0x80);
          if (bVar7) {
            _append_val_null((Parser *)CONCAT17(uVar15,in_stack_fffffffffffffc70),(char *)str);
            _pop_level((Parser *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
            return true;
          }
        }
      }
    }
    _line_progressed(in_stack_fffffffffffffc90,(size_t)in_RDI);
    return local_138 != 0;
  }
  if (local_138 < in_RDI->m_state->indref) {
    bVar7 = has_all(in_RDI,0x80);
    if (bVar7) {
      bVar7 = has_all(in_RDI,4);
      if (bVar7) {
        bVar7 = has_all(in_RDI,0x200);
        if (!bVar7) {
          builtin_strncpy(local_188,"check failed: (has_all(SSCL))",0x1e);
          eVar8 = get_error_flags();
          if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            trap_instruction();
          }
          p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
          Location::Location(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                             (size_t)in_stack_fffffffffffffbb0);
          LVar2.super_LineCol.line = (size_t)pPStack_1a8;
          LVar2.super_LineCol.offset = local_1b0;
          LVar2.super_LineCol.col = local_1a0;
          LVar2.name.str = (char *)sStack_198;
          LVar2.name.len = (size_t)local_190;
          (*p_Var12)(local_188,0x1e,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
          in_stack_fffffffffffffbb0 = pPStack_1a8;
          in_stack_fffffffffffffbb8 = local_1a0;
          in_stack_fffffffffffffbc0 = sStack_198;
          in_stack_fffffffffffffbc8 = local_190;
        }
        local_80 = &local_148;
        local_88 = local_138;
        if (local_140 < local_138) {
          eVar8 = get_error_flags();
          if (((eVar8 & 1) != 0) &&
             (in_stack_fffffffffffffc3f = is_debugger_attached(), (bool)in_stack_fffffffffffffc3f))
          {
            trap_instruction();
          }
          local_98 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_90 = 0x1533;
          handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
        local_1c0 = local_78;
        local_1b8 = local_70;
        _append_key_val_null((Parser *)CONCAT17(uVar15,in_stack_fffffffffffffc70),(char *)str);
      }
      else {
        bVar7 = has_all(in_RDI,8);
        if (bVar7) {
          bVar7 = has_none(in_RDI,0x200);
          if (!bVar7) {
            builtin_strncpy(local_1e8,"check failed: (has_none(SSCL))",0x1f);
            eVar8 = get_error_flags();
            if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              trap_instruction();
            }
            p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
            Location::Location(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                               (size_t)in_stack_fffffffffffffbb0);
            LVar3.super_LineCol.line = (size_t)pPStack_208;
            LVar3.super_LineCol.offset = local_210;
            LVar3.super_LineCol.col = local_200;
            LVar3.name.str = (char *)sStack_1f8;
            LVar3.name.len = (size_t)local_1f0;
            (*p_Var12)(local_1e8,0x1f,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
            in_stack_fffffffffffffbb0 = pPStack_208;
            in_stack_fffffffffffffbb8 = local_200;
            in_stack_fffffffffffffbc0 = sStack_1f8;
            in_stack_fffffffffffffbc8 = local_1f0;
          }
          local_b0 = &local_148;
          local_b8 = local_138;
          if (local_140 < local_138) {
            eVar8 = get_error_flags();
            if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              trap_instruction();
            }
            local_c8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_c0 = 0x1533;
            handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          local_220 = local_a8;
          local_218 = local_a0;
          _append_val_null((Parser *)CONCAT17(uVar15,in_stack_fffffffffffffc70),(char *)str);
        }
      }
    }
    local_228 = (iterator)0x0;
    bVar7 = detail::stack<c4::yml::Parser::State,_16UL>::is_contiguous();
    if (!bVar7) {
      memcpy(local_258,"check failed: (m_stack.is_contiguous())",0x28);
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      pcVar14 = local_258;
      Location::Location(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                         in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                         (size_t)in_stack_fffffffffffffbb0);
      LVar4.super_LineCol.line = (size_t)pPStack_278;
      LVar4.super_LineCol.offset = local_280;
      LVar4.super_LineCol.col = local_270;
      LVar4.name.str = (char *)sStack_268;
      LVar4.name.len = (size_t)local_260;
      (*p_Var12)(pcVar14,0x28,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffbb0 = pPStack_278;
      in_stack_fffffffffffffbb8 = local_270;
      in_stack_fffffffffffffbc0 = sStack_268;
      in_stack_fffffffffffffbc8 = local_260;
    }
    local_288 = in_RDI->m_state;
    do {
      local_288 = local_288 + -1;
      uVar13 = SUB87(local_288,0);
      uVar15 = (undefined1)((ulong)local_288 >> 0x38);
      pSVar10 = detail::stack<c4::yml::Parser::State,_16UL>::begin(&in_RDI->m_stack);
      if ((iterator)CONCAT17(uVar15,uVar13) < pSVar10) goto LAB_003b6542;
    } while (local_288->indref != local_138);
    local_228 = local_288;
    pSVar10 = local_288;
    pSVar11 = detail::stack<c4::yml::Parser::State,_16UL>::begin(&in_RDI->m_stack);
    if ((pSVar11 < pSVar10) &&
       (local_290 = local_228 + -1, local_228[-1].indref == local_228->indref)) {
      local_18 = in_RDI->m_tree;
      local_20 = local_228->node_id;
      local_10 = Tree::_p((Tree *)CONCAT17(uVar15,uVar13),(size_t)pSVar10);
      if (((local_10->m_type).type & SEQ) != NOTYPE) {
        local_30 = in_RDI->m_tree;
        local_38 = local_290->node_id;
        local_28 = Tree::_p((Tree *)CONCAT17(uVar15,uVar13),(size_t)pSVar10);
        if ((((local_28->m_type).type & MAP) != NOTYPE) &&
           (bVar7 = basic_substring<const_char>::begins_with(&local_158,'-'), !bVar7)) {
          local_228 = local_290;
        }
      }
    }
LAB_003b6542:
    if (((local_228 == (iterator)0x0) || (in_RDI->m_state <= local_228)) ||
       (in_RDI->m_state->level <= local_228->level)) {
      bVar7 = is_debugger_attached();
      if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<43ul>
                (local_2a0,(char (*) [43])"ERROR: parse error: incorrect indentation?");
      _err<>(in_stack_00000070,in_stack_00000078);
    }
    while (in_RDI->m_state != local_228) {
      _pop_level((Parser *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
    }
    if (local_138 != in_RDI->m_state->indref) {
      memcpy(local_2c8,"check failed: (ind == m_state->indref)",0x27);
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                         in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                         (size_t)in_stack_fffffffffffffbb0);
      LVar5.super_LineCol.line = uStack_2e8;
      LVar5.super_LineCol.offset = local_2f0;
      LVar5.super_LineCol.col = local_2e0;
      LVar5.name.str = (char *)uStack_2d8;
      LVar5.name.len = local_2d0;
      (*p_Var12)(local_2c8,0x27,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    _line_progressed(in_stack_fffffffffffffc90,(size_t)in_RDI);
    return true;
  }
  if (local_138 <= in_RDI->m_state->indref) {
    memcpy(&stack0xfffffffffffffce8,"check failed: (ind > m_state->indref)",0x26);
    eVar8 = get_error_flags();
    if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0
                       ,in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
    in_stack_fffffffffffffba8 = (flag_t)local_340;
    in_stack_fffffffffffffbac = (flag_t)((ulong)local_340 >> 0x20);
    LVar6.super_LineCol.line = (size_t)pPStack_338;
    LVar6.super_LineCol.offset = local_340;
    LVar6.super_LineCol.col = local_330;
    LVar6.name.str = (char *)uStack_328;
    LVar6.name.len = (size_t)local_320;
    (*p_Var12)(&stack0xfffffffffffffce8,0x26,LVar6,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffbb0 = pPStack_338;
    in_stack_fffffffffffffbc8 = local_320;
  }
  bVar7 = has_all(in_RDI,0x84);
  if (bVar7) {
    local_350 = local_158.str;
    local_348 = local_158.len;
    s_00.len = (size_t)in_stack_fffffffffffffbd0;
    s_00.str = in_stack_fffffffffffffbc8;
    bVar7 = anon_unknown_0::_is_scalar_next__rmap_val(s_00);
    if (bVar7) {
      basic_substring<char_const>::basic_substring<3ul>(local_360,(char (*) [3])":?");
      chars.str._7_1_ = in_stack_fffffffffffffc07;
      chars.str._0_7_ = in_stack_fffffffffffffc00;
      chars.len = (size_t)in_stack_fffffffffffffc08;
      sVar9 = basic_substring<const_char>::first_of
                        (in_stack_fffffffffffffbf8,chars,in_stack_fffffffffffffbf0);
      if (sVar9 == 0xffffffffffffffff) goto LAB_003b6955;
    }
    addrem_flags(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
    _start_unk(in_stack_fffffffffffffbb0,SUB41((uint)in_stack_fffffffffffffbac >> 0x18,0));
    _line_progressed(in_stack_fffffffffffffc90,(size_t)in_RDI);
    _save_indentation(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_d1 = true;
  }
  else {
    bVar7 = has_all(in_RDI,0x88);
    if (!bVar7) {
      bVar7 = is_debugger_attached();
      if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<67ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffffc90,
                 (char (*) [67])"ERROR: parse error - indentation should not increase at this point"
                );
      _err<>(in_stack_00000070,in_stack_00000078);
    }
LAB_003b6955:
    local_d1 = false;
  }
  return local_d1;
}

Assistant:

bool Parser::_handle_indentation()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));
    if( ! _at_line_begin())
        return false;

    size_t ind = m_state->line_contents.indentation;
    csubstr rem = m_state->line_contents.rem;
    /** @todo instead of trimming, we should use the indentation index from above */
    csubstr remt = rem.triml(' ');

    if(remt.empty() || remt.begins_with('#')) // this is a blank or comment line
    {
        _line_progressed(rem.size());
        return true;
    }

    _c4dbgpf("indentation? ind={} indref={}", ind, m_state->indref);
    if(ind == m_state->indref)
    {
        _c4dbgpf("same indentation: {}", ind);
        if(!rem.sub(ind).begins_with('-'))
        {
            _c4dbgp("does not begin with -");
            if(has_any(RMAP))
            {
                if(has_all(SSCL|RVAL))
                {
                    _c4dbgp("add with null val");
                    _append_key_val_null(rem.str + ind - 1);
                    addrem_flags(RKEY, RVAL);
                }
            }
            else if(has_any(RSEQ))
            {
                if(m_stack.size() > 2) // do not pop to root level
                {
                    if(has_any(RNXT))
                    {
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                    else if(has_any(RVAL))
                    {
                        _c4dbgp("add with null val");
                        _append_val_null(rem.str);
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                }
            }
        }
        _line_progressed(ind);
        return ind > 0;
    }
    else if(ind < m_state->indref)
    {
        _c4dbgpf("smaller indentation ({} < {})!!!", ind, m_state->indref);
        if(has_all(RVAL))
        {
            _c4dbgp("there was an empty val -- appending");
            if(has_all(RMAP))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
                _append_key_val_null(rem.sub(ind).str - 1);
            }
            else if(has_all(RSEQ))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
                _append_val_null(rem.sub(ind).str - 1);
            }
        }
        // search the stack frame to jump to based on its indentation
        State const* popto = nullptr;
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.is_contiguous()); // this search relies on the stack being contiguous
        for(State const* s = m_state-1; s >= m_stack.begin(); --s)
        {
            _c4dbgpf("searching for state with indentation {}. curr={} (level={},node={})", ind, s->indref, s->level, s->node_id);
            if(s->indref == ind)
            {
                _c4dbgpf("gotit!!! level={} node={}", s->level, s->node_id);
                popto = s;
                // while it may be tempting to think we're done at this
                // point, we must still determine whether we're jumping to a
                // parent with the same indentation. Consider this case with
                // an indentless sequence:
                //
                // product:
                // - sku: BL394D
                //   quantity: 4
                //   description: Basketball
                //   price: 450.00
                // - sku: BL4438H
                //   quantity: 1
                //   description: Super Hoop
                //   price: 2392.00  # jumping one level here would be wrong.
                // tax: 1234.5       # we must jump two levels
                if(popto > m_stack.begin())
                {
                    auto parent = popto - 1;
                    if(parent->indref == popto->indref)
                    {
                        _c4dbgpf("the parent (level={},node={}) has the same indentation ({}). is this in an indentless sequence?", parent->level, parent->node_id, popto->indref);
                        _c4dbgpf("isseq(popto)={} ismap(parent)={}", m_tree->is_seq(popto->node_id), m_tree->is_map(parent->node_id));
                        if(m_tree->is_seq(popto->node_id) && m_tree->is_map(parent->node_id))
                        {
                            if( ! remt.begins_with('-'))
                            {
                                _c4dbgp("this is an indentless sequence");
                                popto = parent;
                            }
                            else
                            {
                                _c4dbgp("not an indentless sequence");
                            }
                        }
                    }
                }
                break;
            }
        }
        if(!popto || popto >= m_state || popto->level >= m_state->level)
        {
            _c4err("parse error: incorrect indentation?");
        }
        _c4dbgpf("popping {} levels: from level {} to level {}", m_state->level-popto->level, m_state->level, popto->level);
        while(m_state != popto)
        {
            _c4dbgpf("popping level {} (indentation={})", m_state->level, m_state->indref);
            _pop_level();
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind == m_state->indref);
        _line_progressed(ind);
        return true;
    }
    else
    {
        _c4dbgpf("larger indentation ({} > {})!!!", ind, m_state->indref);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind > m_state->indref);
        if(has_all(RMAP|RVAL))
        {
            if(_is_scalar_next__rmap_val(remt) && remt.first_of(":?") == npos)
            {
                _c4dbgpf("actually it seems a value: '{}'", remt);
            }
            else
            {
                addrem_flags(RKEY, RVAL);
                _start_unk();
                //_move_scalar_from_top();
                _line_progressed(ind);
                _save_indentation();
                return true;
            }
        }
        else if(has_all(RSEQ|RVAL))
        {
            // nothing to do here
        }
        else
        {
            _c4err("parse error - indentation should not increase at this point");
        }
    }

    return false;
}